

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmReturnCommand.cxx
# Opt level: O1

bool cmReturnCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  PolicyStatus PVar3;
  int iVar4;
  PolicyID id;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string local_d8;
  string local_b8;
  undefined1 local_98 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined8 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&status->Variables,
                      (status->Variables).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    status->ReturnInvoked = true;
    return true;
  }
  PVar3 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0140,false);
  if (PVar3 - REQUIRED_IF_USED < 2) {
    pcVar1 = status->Makefile;
    local_98._8_8_ = local_98 + 0x10;
    local_98._0_8_ = &DAT_00000001;
    local_98[0x10] = 10;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_b8,(cmPolicies *)0x8c,id);
    local_68._M_len = local_98._0_8_;
    local_68._M_str = (char *)local_98._8_8_;
    local_58._M_dataplus._M_p = (pointer)local_b8._M_string_length;
    local_58._M_string_length = (size_type)local_b8._M_dataplus._M_p;
    views_00._M_len = 2;
    views_00._M_array = &local_68;
    cmCatViews_abi_cxx11_(&local_d8,views_00);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
      cmSystemTools::s_FatalErrorOccurred = true;
      return false;
    }
  }
  else {
    if (PVar3 == OLD) {
      return true;
    }
    if (PVar3 == WARN) {
      pcVar1 = status->Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_b8,(cmPolicies *)0x8c,id);
      local_80 = &local_58;
      local_68._M_len = 1;
      local_58._M_dataplus._M_p._0_1_ = 10;
      local_98._0_8_ = local_b8._M_string_length;
      local_98._8_8_ = local_b8._M_dataplus._M_p;
      local_98._16_8_ = &DAT_00000001;
      local_78 = 0x98;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7bb0a3;
      views._M_len = 3;
      views._M_array = (iterator)local_98;
      local_68._M_str = (char *)local_80;
      cmCatViews_abi_cxx11_(&local_d8,views);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        return true;
      }
      return true;
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pbVar2->_M_string_length == 9) &&
       (iVar4 = bcmp((pbVar2->_M_dataplus)._M_p,"PROPAGATE",9), iVar4 == 0)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
                 pbVar2 + 1,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_68);
      local_98._0_8_ =
           (status->Variables).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_98._8_8_ =
           (status->Variables).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_98._16_8_ =
           (status->Variables).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (status->Variables).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_38;
      (status->Variables).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_30;
      (status->Variables).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
      local_38 = (pointer)0x0;
      local_30 = (pointer)0x0;
      local_28 = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
      status->ReturnInvoked = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_38);
      return true;
    }
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (pbVar2->_M_dataplus)._M_p;
    local_98._16_8_ = pbVar2->_M_string_length;
    local_98._0_8_ = (pointer)0x22;
    local_98._8_8_ = "called with unsupported argument \"";
    local_70 = &local_58;
    local_68._M_len = (size_t)&DAT_00000001;
    local_58._M_dataplus._M_p._0_1_ = 0x22;
    local_78 = 1;
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_98;
    local_68._M_str = (char *)local_70;
    cmCatViews_abi_cxx11_(&local_d8,views_01);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_b8.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
    local_b8._M_dataplus._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      cmSystemTools::s_FatalErrorOccurred = true;
      return false;
    }
  }
  operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  cmSystemTools::s_FatalErrorOccurred = true;
  return false;
}

Assistant:

bool cmReturnCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (!args.empty()) {
    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0140)) {
      case cmPolicies::WARN:
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0140), '\n',
            "return() checks its arguments when the policy is set to NEW. "
            "Since the policy is not set the OLD behavior will be used so "
            "the arguments will be ignored."));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return true;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat('\n', cmPolicies::GetPolicyWarning(cmPolicies::CMP0140)));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      default:
        break;
    }
    if (args[0] != "PROPAGATE"_s) {
      status.SetError(
        cmStrCat("called with unsupported argument \"", args[0], '"'));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    status.SetReturnInvoked({ args.begin() + 1, args.end() });
  } else {
    status.SetReturnInvoked();
  }
  return true;
}